

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_zip_entry_name(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) || (lVar1 = ((*apArg)->x).iVal, lVar1 == 0)
      ) || (*(int *)(lVar1 + 0xa0) != -0x21529ca6)) {
    jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
    jx9_result_bool(pCtx,0);
  }
  else {
    jx9_result_string(pCtx,*(char **)(lVar1 + 0x50),*(int *)(lVar1 + 0x58));
  }
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_name(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	SyString *pName;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Return entry name */
	pName = &pEntry->sFileName;
	jx9_result_string(pCtx, pName->zString, (int)pName->nByte);
	return JX9_OK;
}